

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void Am_Register_For_Undo
               (Am_Object *inter,Am_Object *command_obj,Am_Object *object_modified,
               Am_Inter_Location *data,Am_Impl_Command_Setter *impl_command_setter)

{
  Am_Method_Wrapper *pAVar1;
  bool bVar2;
  Am_Value *value;
  Am_Wrapper *pAVar3;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Inter_Location local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object impl_command;
  undefined1 local_48 [8];
  Am_Register_Command_Method method;
  Am_Object undo_handler;
  Am_Impl_Command_Setter *impl_command_setter_local;
  Am_Inter_Location *data_local;
  Am_Object *object_modified_local;
  Am_Object *command_obj_local;
  Am_Object *inter_local;
  
  Am_Inter_Find_Undo_Handler((Am_Object *)&method.Call);
  Am_Register_Command_Method::Am_Register_Command_Method((Am_Register_Command_Method *)local_48);
  bVar2 = Am_Object::Valid((Am_Object *)&method.Call);
  if (bVar2) {
    value = Am_Object::Get((Am_Object *)&method.Call,0x175,0);
    Am_Register_Command_Method::operator=((Am_Register_Command_Method *)local_48,value);
    bVar2 = Am_Register_Command_Method::Valid((Am_Register_Command_Method *)local_48);
    if ((bVar2) && (impl_command_setter != (Am_Impl_Command_Setter *)0x0)) {
      Am_Object::Am_Object(&local_68,inter);
      Am_Object::Am_Object(&local_70,object_modified);
      Am_Inter_Location::Am_Inter_Location(&local_78,data);
      (*impl_command_setter)
                ((Am_Object_Data *)&local_60,(Am_Object_Data *)&local_68,
                 (Am_Inter_Location_Data *)&local_70);
      Am_Inter_Location::~Am_Inter_Location(&local_78);
      Am_Object::~Am_Object(&local_70);
      Am_Object::~Am_Object(&local_68);
      bVar2 = Am_Object::Valid(&local_60);
      if (bVar2) {
        bVar2 = Am_Object::Valid(command_obj);
        if (bVar2) {
          pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(command_obj);
          Am_Object::Set(&local_60,0x154,pAVar3,0);
        }
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(inter);
        Am_Object::Set(&local_60,0x170,pAVar3,1);
        pAVar1 = method.from_wrapper;
        Am_Object::Am_Object(&local_80,(Am_Object *)&method.Call);
        Am_Object::Am_Object(&local_88,&local_60);
        (*(code *)pAVar1)(&local_80,&local_88);
        Am_Object::~Am_Object(&local_88);
        Am_Object::~Am_Object(&local_80);
      }
      bVar2 = Am_Object::Valid(command_obj);
      if (bVar2) {
        Am_Object::Am_Object(&local_90,(Am_Object *)&method.Call);
        Am_Object::Am_Object(&local_98,command_obj);
        (*(code *)method.from_wrapper)(&local_90,&local_98);
        Am_Object::~Am_Object(&local_98);
        Am_Object::~Am_Object(&local_90);
      }
      Am_Object::~Am_Object(&local_60);
    }
  }
  bVar2 = Am_Object::Valid(command_obj);
  if (bVar2) {
    Am_Process_All_Parent_Commands
              (command_obj,(Am_Object *)&method.Call,(Am_Register_Command_Method *)local_48);
  }
  Am_Object::~Am_Object((Am_Object *)&method.Call);
  return;
}

Assistant:

void
Am_Register_For_Undo(Am_Object inter, Am_Object command_obj,
                     Am_Object object_modified, Am_Inter_Location data,
                     Am_Impl_Command_Setter *impl_command_setter)
{
  Am_Object undo_handler = Am_Inter_Find_Undo_Handler(inter);
  Am_Register_Command_Method method;
  if (undo_handler.Valid()) {
    method = undo_handler.Get(Am_REGISTER_COMMAND);
    if (method.Valid() && impl_command_setter) {
      Am_Object impl_command =
          impl_command_setter(inter, object_modified, data);
      if (impl_command.Valid()) {
        if (command_obj.Valid())
          impl_command.Set(Am_IMPLEMENTATION_PARENT, command_obj);
        impl_command.Set(Am_SAVED_OLD_OWNER, inter, Am_OK_IF_NOT_THERE);
        method.Call(undo_handler, impl_command);
      }
      if (command_obj.Valid())
        method.Call(undo_handler, command_obj);
    }
  }
  if (command_obj.Valid()) {
    Am_Process_All_Parent_Commands(command_obj, undo_handler, method);
  }
}